

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.h
# Opt level: O1

bool google::protobuf::internal::AllAreInitialized<google::protobuf::UninterpretedOption>
               (RepeatedPtrField<google::protobuf::UninterpretedOption> *t)

{
  bool bVar1;
  int iVar2;
  Type *pTVar3;
  Type *pTVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  
  iVar6 = (t->super_RepeatedPtrFieldBase).current_size_;
  bVar5 = iVar6 < 1;
  if (0 < iVar6) {
    do {
      pTVar3 = RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>::TypeHandler>
                         (&t->super_RepeatedPtrFieldBase,iVar6 + -1);
      iVar2 = (pTVar3->name_).super_RepeatedPtrFieldBase.current_size_;
      do {
        iVar7 = iVar2;
        if (iVar7 < 1) goto LAB_00386db3;
        pTVar4 = RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart>::TypeHandler>
                           (&(pTVar3->name_).super_RepeatedPtrFieldBase,iVar7 + -1);
        iVar2 = iVar7 + -1;
      } while ((~(pTVar4->_has_bits_).has_bits_[0] & 3) == 0);
      if (0 < iVar7) {
        return bVar5;
      }
LAB_00386db3:
      bVar5 = iVar6 < 2;
      bVar1 = 1 < iVar6;
      iVar6 = iVar6 + -1;
    } while (bVar1);
  }
  return bVar5;
}

Assistant:

bool AllAreInitialized(const RepeatedPtrField<Msg>& t) {
  for (int i = t.size(); --i >= 0;) {
    if (!t.Get(i).IsInitialized()) return false;
  }
  return true;
}